

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetStabilityFn(void *arkode_mem,ARKExpStabFn EStab,void *estab_data)

{
  undefined8 in_RDX;
  long in_RSI;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  local_4 = arkAccessHAdaptMem((void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                               ,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                               (ARKodeHAdaptMem *)0xeacf7c);
  if (local_4 == 0) {
    if (in_RSI == 0) {
      *(code **)(in_stack_ffffffffffffffd0 + 0xc0) = arkExpStab;
      *(ARKodeMem **)(in_stack_ffffffffffffffd0 + 200) = in_stack_ffffffffffffffc8;
    }
    else {
      *(long *)(in_stack_ffffffffffffffd0 + 0xc0) = in_RSI;
      *(undefined8 *)(in_stack_ffffffffffffffd0 + 200) = in_RDX;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkSetStabilityFn(void *arkode_mem, ARKExpStabFn EStab, void *estab_data)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetStabilityFn",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* NULL argument sets default, otherwise set inputs */
  if (EStab == NULL) {
    hadapt_mem->expstab    = arkExpStab;
    hadapt_mem->estab_data = ark_mem;
  } else {
    hadapt_mem->expstab    = EStab;
    hadapt_mem->estab_data = estab_data;
  }

  return(ARK_SUCCESS);
}